

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorRK64.cpp
# Opt level: O2

int __thiscall pele::physics::reactions::ReactorRK64::init(ReactorRK64 *this,EVP_PKEY_CTX *ctx)

{
  ParmParse pp;
  allocator local_81;
  string local_80;
  ParmParse local_60;
  
  this->m_reactor_type = (int)ctx;
  ReactorTypes::check_reactor_type((int)ctx);
  std::__cxx11::string::string((string *)&local_80,"ode",&local_81);
  amrex::ParmParse::ParmParse(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  amrex::ParmParse::query
            (&local_60,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorRK64>).super_ReactorBase.
              verbose,0);
  amrex::ParmParse::query(&local_60,"atol",&this->absTol,0);
  amrex::ParmParse::query(&local_60,"rk64_nsubsteps_guess",&this->rk64_nsubsteps_guess,0);
  amrex::ParmParse::query(&local_60,"rk64_nsubsteps_min",&this->rk64_nsubsteps_min,0);
  amrex::ParmParse::query(&local_60,"rk64_nsubsteps_max",&this->rk64_nsubsteps_max,0);
  amrex::ParmParse::query(&local_60,"clean_init_massfrac",&this->m_clean_init_massfrac,0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_60);
  return 0;
}

Assistant:

int
ReactorRK64::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorRK64::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("atol", absTol);
  pp.query("rk64_nsubsteps_guess", rk64_nsubsteps_guess);
  pp.query("rk64_nsubsteps_min", rk64_nsubsteps_min);
  pp.query("rk64_nsubsteps_max", rk64_nsubsteps_max);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  return (0);
}